

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

Vec_Int_t * Abc_NtkRetimeInitialValues(Abc_Ntk_t *pNtkCone,Vec_Int_t *vValues,int fVerbose)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  abctime aVar3;
  abctime aVar4;
  int *piVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *p;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar7;
  Vec_Int_t *pVVar8;
  size_t __size;
  int iVar9;
  Abc_Ntk_t *pAVar10;
  char *__s;
  uint uVar11;
  long lVar12;
  
  if (pNtkCone == (Abc_Ntk_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    iVar1 = vValues->nSize;
    pVVar8->nSize = iVar1;
    pVVar8->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __size = 0;
      piVar5 = (int *)0x0;
    }
    else {
      __size = (long)iVar1 << 2;
      piVar5 = (int *)malloc(__size);
    }
    pVVar8->pArray = piVar5;
    memcpy(piVar5,vValues->pArray,__size);
    return pVVar8;
  }
  pNtk = Abc_NtkDup(pNtkCone);
  Abc_NtkToAig(pNtk);
  pNtk_00 = Abc_NtkCreateTarget(pNtk,pNtk->vCos,vValues);
  if (fVerbose != 0) {
    printf("The miter for initial state computation has %d AIG nodes. ",
           (ulong)(uint)pNtk_00->nObjCounts[7]);
  }
  aVar3 = Abc_Clock();
  pAVar10 = pNtk_00;
  iVar1 = Abc_NtkMiterSat(pNtk_00,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
  iVar9 = (int)pAVar10;
  if (fVerbose != 0) {
    Abc_Print(iVar9,"%s =","SAT solving time");
    aVar4 = Abc_Clock();
    Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  }
  if (iVar1 == -1) {
    __s = "Abc_NtkRetimeInitialValues(): The SAT problem timed out. DC latch values are used.";
  }
  else {
    if (iVar1 != 1) {
      if ((pNtkCone->ntkFunc != ABC_FUNC_SOP) || (pNtkCone->ntkType != ABC_NTK_LOGIC)) {
        __assert_fail("Abc_NtkIsSopLogic(pNtkCone)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retInit.c"
                      ,0x8a,"int Abc_NtkRetimeVerifyModel(Abc_Ntk_t *, Vec_Int_t *, int *)");
      }
      piVar5 = pNtk_00->pModel;
      for (lVar12 = 0; lVar12 < pNtkCone->vPis->nSize; lVar12 = lVar12 + 1) {
        pAVar6 = Abc_NtkPi(pNtkCone,(int)lVar12);
        pAVar6->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)piVar5[lVar12];
      }
      p = Abc_NtkDfs(pNtkCone,0);
      for (iVar9 = 0; iVar9 < p->nSize; iVar9 = iVar9 + 1) {
        pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar9);
        aVar7._0_4_ = Abc_ObjSopSimulate(pAVar6);
        aVar7._4_4_ = 0;
        pAVar6->field_6 = aVar7;
      }
      Vec_PtrFree(p);
      for (iVar9 = 0; iVar2 = pNtkCone->vPos->nSize, iVar9 < iVar2; iVar9 = iVar9 + 1) {
        pAVar6 = Abc_NtkPo(pNtkCone,iVar9);
        pAVar6->field_6 =
             *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
              ((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] + 0x40);
      }
      uVar11 = 0;
      for (iVar9 = 0; iVar9 < iVar2; iVar9 = iVar9 + 1) {
        pAVar6 = Abc_NtkPo(pNtkCone,iVar9);
        iVar2 = Vec_IntEntry(vValues,iVar9);
        uVar11 = uVar11 + (iVar2 != (pAVar6->field_6).iTemp);
        iVar2 = pNtkCone->vPos->nSize;
      }
      if (uVar11 != 0) {
        printf("%d outputs (out of %d) have a value mismatch.\n",(ulong)uVar11);
      }
      if (iVar1 == 0) {
        piVar5 = pNtk_00->pModel;
        iVar1 = pNtk->vPis->nSize;
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nSize = iVar1;
        pVVar8->nCap = iVar1;
        pVVar8->pArray = piVar5;
      }
      else {
        pVVar8 = (Vec_Int_t *)0x0;
      }
      goto LAB_003bd5ce;
    }
    __s = "Abc_NtkRetimeInitialValues(): The problem is unsatisfiable. DC latch values are used.";
  }
  puts(__s);
  pVVar8 = (Vec_Int_t *)0x0;
LAB_003bd5ce:
  pNtk_00->pModel = (int *)0x0;
  Abc_NtkDelete(pNtk_00);
  Abc_NtkDelete(pNtk);
  return pVVar8;
}

Assistant:

Vec_Int_t * Abc_NtkRetimeInitialValues( Abc_Ntk_t * pNtkCone, Vec_Int_t * vValues, int fVerbose )
{
    Vec_Int_t * vSolution;
    Abc_Ntk_t * pNtkMiter, * pNtkLogic;
    int RetValue;
    abctime clk;
    if ( pNtkCone == NULL )
        return Vec_IntDup( vValues );
    // convert the target network to AIG
    pNtkLogic = Abc_NtkDup( pNtkCone );
    Abc_NtkToAig( pNtkLogic );
    // get the miter
    pNtkMiter = Abc_NtkCreateTarget( pNtkLogic, pNtkLogic->vCos, vValues );
    if ( fVerbose )
        printf( "The miter for initial state computation has %d AIG nodes. ", Abc_NtkNodeNum(pNtkMiter) );
    // solve the miter
    clk = Abc_Clock();
    RetValue = Abc_NtkMiterSat( pNtkMiter, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );
    if ( fVerbose ) 
        { ABC_PRT( "SAT solving time", Abc_Clock() - clk ); }
    // analyze the result
    if ( RetValue == 1 )
        printf( "Abc_NtkRetimeInitialValues(): The problem is unsatisfiable. DC latch values are used.\n" );
    else if ( RetValue == -1 )
        printf( "Abc_NtkRetimeInitialValues(): The SAT problem timed out. DC latch values are used.\n" );
    else if ( !Abc_NtkRetimeVerifyModel( pNtkCone, vValues, pNtkMiter->pModel ) )
        printf( "Abc_NtkRetimeInitialValues(): The computed counter-example is incorrect.\n" );
    // set the values of the latches
    vSolution = RetValue? NULL : Vec_IntAllocArray( pNtkMiter->pModel, Abc_NtkPiNum(pNtkLogic) );
    pNtkMiter->pModel = NULL;
    Abc_NtkDelete( pNtkMiter );
    Abc_NtkDelete( pNtkLogic );
    return vSolution;
}